

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationPrimitiveDiscardTests.cpp
# Opt level: O1

TestCaseGroup * vkt::tessellation::createPrimitiveDiscardTests(TestContext *testCtx)

{
  TestContext *testCtx_00;
  TestNode *this;
  ulong uVar1;
  long *plVar2;
  TestNode *node;
  long *plVar3;
  ulong uVar4;
  size_type sVar5;
  bool bVar6;
  bool bVar7;
  string caseName;
  long *local_190;
  long local_188;
  long local_180;
  long lStack_178;
  long local_170;
  long *local_168;
  long local_160;
  long local_158;
  long lStack_150;
  long *local_148;
  long local_140;
  long local_138;
  long lStack_130;
  size_type local_128;
  ulong local_120;
  long *local_118;
  long local_110;
  long local_108;
  long lStack_100;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88;
  undefined7 uStack_87;
  size_type local_78;
  ulong local_70;
  long local_68;
  long local_60;
  ulong local_58;
  pointer local_50;
  char *local_48;
  size_type local_40;
  char *local_38;
  
  this = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,testCtx,"primitive_discard",
             "Test primitive discard with relevant outer tessellation level <= 0.0");
  uVar4 = 0;
  do {
    local_68 = uVar4 * 4;
    local_170 = 0;
    local_58 = uVar4;
    do {
      local_50 = (pointer)(local_170 << 0x20 | uVar4);
      local_60 = local_170 * 4;
      sVar5 = 0;
      do {
        local_48 = (char *)0x0;
        if (sVar5 == 1) {
          local_48 = "cw";
        }
        if (sVar5 == 0) {
          local_48 = "ccw";
        }
        uVar1 = 0;
        local_78 = sVar5;
        do {
          bVar6 = local_170 == 1;
          bVar7 = uVar4 != 2;
          local_38 = "";
          if ((uVar1 & 1) != 0) {
            local_38 = "_point_mode";
          }
          local_120 = 0;
          local_128 = sVar5;
          local_70 = uVar1;
          local_40 = sVar5;
          do {
            if ((((((byte)uVar1 ^ 1) & 1) == 0 && bVar6) && bVar7) || ((local_120 & 1) != 0)) {
              local_90 = 0;
              local_88 = 0;
              local_98 = &local_88;
              plVar2 = (long *)std::__cxx11::string::append((char *)&local_98);
              plVar3 = plVar2 + 2;
              if ((long *)*plVar2 == plVar3) {
                local_c8 = *plVar3;
                lStack_c0 = plVar2[3];
                local_d8 = &local_c8;
              }
              else {
                local_c8 = *plVar3;
                local_d8 = (long *)*plVar2;
              }
              local_d0 = plVar2[1];
              *plVar2 = (long)plVar3;
              plVar2[1] = 0;
              *(undefined1 *)(plVar2 + 2) = 0;
              plVar2 = (long *)std::__cxx11::string::append((char *)&local_d8);
              plVar3 = plVar2 + 2;
              if ((long *)*plVar2 == plVar3) {
                local_a8 = *plVar3;
                lStack_a0 = plVar2[3];
                local_b8 = &local_a8;
              }
              else {
                local_a8 = *plVar3;
                local_b8 = (long *)*plVar2;
              }
              local_b0 = plVar2[1];
              *plVar2 = (long)plVar3;
              plVar2[1] = 0;
              *(undefined1 *)(plVar2 + 2) = 0;
              plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
              plVar3 = plVar2 + 2;
              if ((long *)*plVar2 == plVar3) {
                local_108 = *plVar3;
                lStack_100 = plVar2[3];
                local_118 = &local_108;
              }
              else {
                local_108 = *plVar3;
                local_118 = (long *)*plVar2;
              }
              local_110 = plVar2[1];
              *plVar2 = (long)plVar3;
              plVar2[1] = 0;
              *(undefined1 *)(plVar2 + 2) = 0;
              plVar2 = (long *)std::__cxx11::string::append((char *)&local_118);
              plVar3 = plVar2 + 2;
              if ((long *)*plVar2 == plVar3) {
                local_e8 = *plVar3;
                lStack_e0 = plVar2[3];
                local_f8 = &local_e8;
              }
              else {
                local_e8 = *plVar3;
                local_f8 = (long *)*plVar2;
              }
              local_f0 = plVar2[1];
              *plVar2 = (long)plVar3;
              plVar2[1] = 0;
              *(undefined1 *)(plVar2 + 2) = 0;
              plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
              local_168 = &local_158;
              plVar3 = plVar2 + 2;
              if ((long *)*plVar2 == plVar3) {
                local_158 = *plVar3;
                lStack_150 = plVar2[3];
              }
              else {
                local_158 = *plVar3;
                local_168 = (long *)*plVar2;
              }
              local_160 = plVar2[1];
              *plVar2 = (long)plVar3;
              plVar2[1] = 0;
              *(undefined1 *)(plVar2 + 2) = 0;
              plVar2 = (long *)std::__cxx11::string::append((char *)&local_168);
              plVar3 = plVar2 + 2;
              if ((long *)*plVar2 == plVar3) {
                local_180 = *plVar3;
                lStack_178 = plVar2[3];
                local_190 = &local_180;
              }
              else {
                local_180 = *plVar3;
                local_190 = (long *)*plVar2;
              }
              local_188 = plVar2[1];
              *plVar2 = (long)plVar3;
              plVar2[1] = 0;
              *(undefined1 *)(plVar2 + 2) = 0;
              plVar2 = (long *)std::__cxx11::string::append((char *)&local_190);
              local_148 = &local_138;
              plVar3 = plVar2 + 2;
              if ((long *)*plVar2 == plVar3) {
                local_138 = *plVar3;
                lStack_130 = plVar2[3];
              }
              else {
                local_138 = *plVar3;
                local_148 = (long *)*plVar2;
              }
              local_140 = plVar2[1];
              *plVar2 = (long)plVar3;
              plVar2[1] = 0;
              *(undefined1 *)(plVar2 + 2) = 0;
              if (local_190 != &local_180) {
                operator_delete(local_190,local_180 + 1);
              }
              if (local_168 != &local_158) {
                operator_delete(local_168,local_158 + 1);
              }
              if (local_f8 != &local_e8) {
                operator_delete(local_f8,local_e8 + 1);
              }
              if (local_118 != &local_108) {
                operator_delete(local_118,local_108 + 1);
              }
              if (local_b8 != &local_a8) {
                operator_delete(local_b8,local_a8 + 1);
              }
              if (local_d8 != &local_c8) {
                operator_delete(local_d8,local_c8 + 1);
              }
              if (local_98 != &local_88) {
                operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
              }
              local_190 = &local_180;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"");
              testCtx_00 = this->m_testCtx;
              node = (TestNode *)operator_new(0x90);
              tcu::TestCase::TestCase
                        ((TestCase *)node,testCtx_00,NODETYPE_SELF_VALIDATE,(char *)local_148,
                         (char *)local_190);
              node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2ed90;
              node[1]._vptr_TestNode = (_func_int **)anon_unknown_0::initPrograms;
              node[1].m_testCtx = (TestContext *)anon_unknown_0::test;
              node[1].m_name._M_dataplus._M_p = local_50;
              node[1].m_name._M_string_length = local_128;
              tcu::TestNode::addChild(this,node);
              if (local_190 != &local_180) {
                operator_delete(local_190,local_180 + 1);
              }
              uVar4 = local_58;
              sVar5 = local_40;
              if (local_148 != &local_138) {
                operator_delete(local_148,local_138 + 1);
                uVar4 = local_58;
                sVar5 = local_40;
              }
            }
            local_120 = local_120 + 1;
            local_128 = local_128 + 0x10000000000;
          } while (local_120 == 1);
          uVar1 = local_70 + 1;
          sVar5 = sVar5 + 0x100000000;
        } while (local_70 == 0);
        sVar5 = local_78 + 1;
      } while (local_78 == 0);
      local_170 = local_170 + 1;
    } while (local_170 != 3);
    uVar4 = uVar4 + 1;
  } while (uVar4 != 3);
  return (TestCaseGroup *)this;
}

Assistant:

tcu::TestCaseGroup* createPrimitiveDiscardTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> group (new tcu::TestCaseGroup(testCtx, "primitive_discard", "Test primitive discard with relevant outer tessellation level <= 0.0"));

	for (int primitiveTypeNdx = 0; primitiveTypeNdx < TESSPRIMITIVETYPE_LAST; primitiveTypeNdx++)
	for (int spacingModeNdx = 0; spacingModeNdx < SPACINGMODE_LAST; spacingModeNdx++)
	for (int windingNdx = 0; windingNdx < WINDING_LAST; windingNdx++)
	for (int usePointModeNdx = 0; usePointModeNdx <= 1; usePointModeNdx++)
	for (int lessThanOneInnerLevelsNdx = 0; lessThanOneInnerLevelsNdx <= 1; lessThanOneInnerLevelsNdx++)
	{
		const CaseDefinition caseDef =
		{
			(TessPrimitiveType)primitiveTypeNdx,
			(SpacingMode)spacingModeNdx,
			(Winding)windingNdx,
			(usePointModeNdx != 0),
			(lessThanOneInnerLevelsNdx != 0)
		};

		if (lessThanOneInnerLevelsDefined(caseDef) && !caseDef.useLessThanOneInnerLevels)
			continue; // No point generating a separate case as <= 1 inner level behavior is well-defined

		const std::string caseName = std::string() + getTessPrimitiveTypeShaderName(caseDef.primitiveType)
									 + "_" + getSpacingModeShaderName(caseDef.spacingMode)
									 + "_" + getWindingShaderName(caseDef.winding)
									 + (caseDef.usePointMode ? "_point_mode" : "")
									 + (caseDef.useLessThanOneInnerLevels ? "" : "_valid_levels");

		addFunctionCaseWithPrograms(group.get(), caseName, "", initPrograms, test, caseDef);
	}

	return group.release();
}